

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_opts.c
# Opt level: O1

int zt_opt_help_stdout(int argn,int defn,int *argc,char **argv,zt_opt_def_t *def,zt_opt_error error)

{
  zt_opt_callback p_Var1;
  int iVar2;
  char *pcVar3;
  
  pcVar3 = "";
  if ((char *)def[defn].cb_data != (char *)0x0) {
    pcVar3 = (char *)def[defn].cb_data;
  }
  printf("Usage: %s %s\nOptions:\n",*argv,pcVar3);
  p_Var1 = def->cb;
  while( true ) {
    if (p_Var1 == (zt_opt_callback)0x0) {
      (*error)(0,(char *)0x0);
      return 0;
    }
    iVar2 = _zt_opt_help_stdout_printer(def);
    if (iVar2 < 0) break;
    p_Var1 = def[1].cb;
    def = def + 1;
  }
  (*error)(0,"Programmer Error: must have a short or long opt at least",0);
  return -1;
}

Assistant:

int
zt_opt_help_stdout(int argn, int defn, int * argc, char ** argv, zt_opt_def_t * def, zt_opt_error error) {
    int    i;
    char * help = def[defn].cb_data;

    printf("Usage: %s %s\nOptions:\n", argv[0], help ? help : "");

    for (i = 0; def[i].cb; i++) {
        if (_zt_opt_help_stdout_printer(&def[i]) < 0) {
            error(0, "Programmer Error: must have a short or long opt at least", NULL);
            return -1;
        }
    }

    error(0, NULL);

    return 0;
}